

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decay.c
# Opt level: O2

_Bool duckdb_je_decay_init(decay_t *decay,nstime_t *cur_time,ssize_t decay_ms)

{
  _Bool _Var1;
  
  _Var1 = duckdb_je_malloc_mutex_init
                    (&decay->mtx,"decay",WITNESS_RANK_CORE,malloc_mutex_rank_exclusive);
  if (!_Var1) {
    decay->purging = false;
    duckdb_je_decay_reinit(decay,cur_time,decay_ms);
  }
  return _Var1;
}

Assistant:

bool
decay_init(decay_t *decay, nstime_t *cur_time, ssize_t decay_ms) {
	if (config_debug) {
		for (size_t i = 0; i < sizeof(decay_t); i++) {
			assert(((char *)decay)[i] == 0);
		}
		decay->ceil_npages = 0;
	}
	if (malloc_mutex_init(&decay->mtx, "decay", WITNESS_RANK_DECAY,
	    malloc_mutex_rank_exclusive)) {
		return true;
	}
	decay->purging = false;
	decay_reinit(decay, cur_time, decay_ms);
	return false;
}